

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_p.h
# Opt level: O2

uint32_t adler32_len_16(uint32_t adler,uint8_t *buf,size_t len,uint32_t sum2)

{
  uint uVar1;
  size_t sVar3;
  ulong uVar2;
  
  uVar2 = (ulong)adler;
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = (int)uVar2 + (uint)buf[sVar3];
    uVar2 = (ulong)uVar1;
    sum2 = sum2 + uVar1;
  }
  return (uint)(uVar2 % 0xfff1) | sum2 % 0xfff1 << 0x10;
}

Assistant:

static inline uint32_t adler32_len_16(uint32_t adler, const uint8_t *buf, size_t len, uint32_t sum2) {
    while (len) {
        --len;
        adler += *buf++;
        sum2 += adler;
    }
    adler %= BASE;
    sum2 %= BASE;            /* only added so many BASE's */
    /* return recombined sums */
    return adler | (sum2 << 16);
}